

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_info_cert_policies(char **buf,size_t *size,mbedtls_x509_sequence *certificate_policies)

{
  int iVar1;
  char *local_58;
  char *sep;
  mbedtls_x509_sequence *cur;
  char *p;
  size_t n;
  char *desc;
  mbedtls_x509_sequence *pmStack_28;
  int ret;
  mbedtls_x509_sequence *certificate_policies_local;
  size_t *size_local;
  char **buf_local;
  
  desc._4_4_ = -0x6e;
  p = (char *)*size;
  cur = (mbedtls_x509_sequence *)*buf;
  local_58 = anon_var_dwarf_36a810 + 9;
  sep = (char *)certificate_policies;
  pmStack_28 = certificate_policies;
  certificate_policies_local = (mbedtls_x509_sequence *)size;
  size_local = (size_t *)buf;
  while( true ) {
    if (sep == (char *)0x0) {
      *(char **)&certificate_policies_local->buf = p;
      *size_local = (size_t)cur;
      return 0;
    }
    iVar1 = mbedtls_oid_get_certificate_policies((mbedtls_asn1_buf *)sep,(char **)&n);
    if (iVar1 != 0) {
      n = (size_t)anon_var_dwarf_35b796;
    }
    desc._4_4_ = snprintf((char *)cur,(size_t)p,"%s%s",local_58,n);
    if ((desc._4_4_ < 0) || (p <= (char *)(long)desc._4_4_)) break;
    p = p + -(long)desc._4_4_;
    cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)desc._4_4_);
    local_58 = ", ";
    sep = *(char **)(sep + 0x18);
  }
  return -0x2980;
}

Assistant:

static int x509_info_cert_policies(char **buf, size_t *size,
                                   const mbedtls_x509_sequence *certificate_policies)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const char *desc;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = certificate_policies;
    const char *sep = "";

    while (cur != NULL) {
        if (mbedtls_oid_get_certificate_policies(&cur->buf, &desc) != 0) {
            desc = "???";
        }

        ret = mbedtls_snprintf(p, n, "%s%s", sep, desc);
        MBEDTLS_X509_SAFE_SNPRINTF;

        sep = ", ";

        cur = cur->next;
    }

    *size = n;
    *buf = p;

    return 0;
}